

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delta.c
# Opt level: O0

void Delta_Encode(Byte *state,uint delta,Byte *data,SizeT size)

{
  Byte BVar1;
  ulong in_RCX;
  long in_RDX;
  uint in_ESI;
  Byte *in_RDI;
  Byte b;
  SizeT i;
  uint j;
  Byte buf [256];
  ulong local_138;
  uint local_12c;
  Byte local_128 [264];
  ulong local_20;
  long local_18;
  uint local_c;
  Byte *local_8;
  
  local_12c = 0;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  MyMemCpy(local_128,in_RDI,in_ESI);
  local_138 = 0;
  while (local_138 < local_20) {
    for (local_12c = 0; local_12c < local_c && local_138 < local_20; local_12c = local_12c + 1) {
      BVar1 = *(Byte *)(local_18 + local_138);
      *(Byte *)(local_18 + local_138) = BVar1 - local_128[local_12c];
      local_128[local_12c] = BVar1;
      local_138 = local_138 + 1;
    }
  }
  if (local_12c == local_c) {
    local_12c = 0;
  }
  MyMemCpy(local_8,local_128 + local_12c,local_c - local_12c);
  MyMemCpy(local_8 + ((ulong)local_c - (ulong)local_12c),local_128,local_12c);
  return;
}

Assistant:

void Delta_Encode(Byte *state, unsigned delta, Byte *data, SizeT size)
{
  Byte buf[DELTA_STATE_SIZE];
  unsigned j = 0;
  MyMemCpy(buf, state, delta);
  {
    SizeT i;
    for (i = 0; i < size;)
    {
      for (j = 0; j < delta && i < size; i++, j++)
      {
        Byte b = data[i];
        data[i] = (Byte)(b - buf[j]);
        buf[j] = b;
      }
    }
  }
  if (j == delta)
    j = 0;
  MyMemCpy(state, buf + j, delta - j);
  MyMemCpy(state + delta - j, buf, j);
}